

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateParser
          (ImmutableMessageGenerator *this,Printer *printer)

{
  bool bVar1;
  char *__s;
  allocator<char> local_39;
  string local_38;
  
  __s = "private";
  if (*(int *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x10) + 0x8c) == 2) {
    __s = "@java.lang.Deprecated public";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  io::Printer::Print(printer,
                     "$visibility$ static final com.google.protobuf.Parser<$classname$>\n    PARSER = new com.google.protobuf.AbstractParser<$classname$>() {\n"
                     ,"visibility",&local_38,"classname",
                     *(string **)(this->super_MessageGenerator).descriptor_);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "public $classname$ parsePartialFrom(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
                     ,"classname",*(string **)(this->super_MessageGenerator).descriptor_);
  bVar1 = Context::HasGeneratedMethods(this->context_,(this->super_MessageGenerator).descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,"    return new $classname$(input, extensionRegistry);\n","classname"
                       ,*(string **)(this->super_MessageGenerator).descriptor_);
  }
  else {
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "Builder builder = newBuilder();\ntry {\n  builder.mergeFrom(input, extensionRegistry);\n} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw e.setUnfinishedMessage(builder.buildPartial());\n} catch (java.io.IOException e) {\n  throw new com.google.protobuf.InvalidProtocolBufferException(\n      e.getMessage()).setUnfinishedMessage(\n          builder.buildPartial());\n}\nreturn builder.buildPartial();\n"
                      );
    io::Printer::Outdent(printer);
  }
  io::Printer::Print(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"};\n\n");
  io::Printer::Print(printer,
                     "public static com.google.protobuf.Parser<$classname$> parser() {\n  return PARSER;\n}\n\n@java.lang.Override\npublic com.google.protobuf.Parser<$classname$> getParserForType() {\n  return PARSER;\n}\n\n"
                     ,"classname",*(string **)(this->super_MessageGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateParser(io::Printer* printer) {
  printer->Print(
      "$visibility$ static final com.google.protobuf.Parser<$classname$>\n"
      "    PARSER = new com.google.protobuf.AbstractParser<$classname$>() {\n",
      "visibility",
      ExposePublicParser(descriptor_->file()) ? "@java.lang.Deprecated public"
                                              : "private",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Print(
      "public $classname$ parsePartialFrom(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print(
        "    return new $classname$(input, extensionRegistry);\n",
        "classname", descriptor_->name());
  } else {
    // When parsing constructor isn't generated, use builder to parse
    // messages. Note, will fallback to use reflection based mergeFieldFrom()
    // in AbstractMessage.Builder.
    printer->Indent();
    printer->Print(
        "Builder builder = newBuilder();\n"
        "try {\n"
        "  builder.mergeFrom(input, extensionRegistry);\n"
        "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
        "  throw e.setUnfinishedMessage(builder.buildPartial());\n"
        "} catch (java.io.IOException e) {\n"
        "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
        "      e.getMessage()).setUnfinishedMessage(\n"
        "          builder.buildPartial());\n"
        "}\n"
        "return builder.buildPartial();\n");
    printer->Outdent();
  }
  printer->Print(
        "}\n");
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");

  printer->Print(
      "public static com.google.protobuf.Parser<$classname$> parser() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n"
      "@java.lang.Override\n"
      "public com.google.protobuf.Parser<$classname$> getParserForType() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());
}